

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableSlow<google::protobuf::internal::LazyString>
          (ArenaStringPtr *this,Arena *arena,LazyString *lazy_default)

{
  LazyString *arena_00;
  bool bVar1;
  LogMessage *other;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  string *new_string;
  byte local_61;
  LogMessage local_60;
  undefined8 local_28;
  string *default_value;
  LazyString *lazy_default_local;
  Arena *arena_local;
  ArenaStringPtr *this_local;
  
  local_28 = 0;
  default_value = (string *)lazy_default;
  lazy_default_local = (LazyString *)arena;
  arena_local = (Arena *)this;
  bVar1 = IsDefault(this,(string *)0x0);
  local_61 = 0;
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.cc"
               ,0x9b);
    local_61 = 1;
    other = LogMessage::operator<<(&local_60,"CHECK failed: IsDefault(default_value): ");
    LogFinisher::operator=((LogFinisher *)((long)&new_string + 3),other);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  arena_00 = lazy_default_local;
  args = LazyString::get_abi_cxx11_((LazyString *)default_value);
  p = Arena::Create<std::__cxx11::string,std::__cxx11::string_const&>((Arena *)arena_00,args);
  TaggedPtr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
            (&this->tagged_ptr_,p);
  return p;
}

Assistant:

std::string* ArenaStringPtr::MutableSlow(::google::protobuf::Arena* arena,
                                         const Lazy&... lazy_default) {
  const std::string* const default_value =
      sizeof...(Lazy) == 0 ? &GetEmptyStringAlreadyInited() : nullptr;
  GOOGLE_DCHECK(IsDefault(default_value));
  std::string* new_string =
      Arena::Create<std::string>(arena, lazy_default.get()...);
  tagged_ptr_.Set(new_string);
  return new_string;
}